

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressBlock_internal
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_matchState_t *ms;
  BYTE **ppBVar1;
  FSE_CTable *__dest;
  FSE_CTable *__dest_00;
  undefined8 uVar2;
  undefined8 uVar3;
  U32 UVar4;
  ZSTD_strategy ZVar5;
  HUF_repeat HVar6;
  FSE_repeat FVar7;
  ZSTD_compressedBlockState_t *pZVar8;
  BYTE *src_00;
  BYTE *pBVar9;
  undefined1 auVar10 [16];
  ZSTD_entropyCTables_t *pZVar11;
  U32 *workspace;
  seqDef *psVar12;
  bool bVar13;
  size_t sVar14;
  byte *pbVar15;
  long lVar16;
  byte *code;
  uint uVar17;
  int iVar18;
  int iVar19;
  FSE_repeat FVar20;
  size_t unaff_RBP;
  ulong uVar21;
  byte *pbVar22;
  uint uVar23;
  long lVar24;
  symbolEncodingType_e type;
  ulong srcSize_00;
  ulong uVar25;
  uint *puVar26;
  ZSTD_compressedBlockState_t *pZVar27;
  BYTE *istart;
  FSE_CTable *__dest_01;
  undefined8 uVar28;
  undefined1 auVar29 [16];
  size_t sVar30;
  U32 max;
  ZSTD_compressedBlockState_t *local_190;
  uint *local_188;
  U32 *local_180;
  seqDef *local_178;
  ulong local_170;
  seqStore_t *local_168;
  BYTE *local_160;
  BYTE *local_158;
  ulong local_150;
  BYTE *local_148;
  size_t local_140;
  FSE_CTable *local_138;
  FSE_CTable *local_130;
  FSE_CTable *local_128;
  seqDef *local_120;
  ulong local_118;
  undefined8 local_110;
  rawSeqStore_t ldmSeqStore;
  
  if (srcSize < 7) {
    ZSTD_ldm_skipSequences(&zc->externSeqStore,srcSize,(zc->appliedParams).cParams.searchLength);
    return 0;
  }
  (zc->seqStore).lit = (zc->seqStore).litStart;
  (zc->seqStore).sequences = (zc->seqStore).sequencesStart;
  (zc->seqStore).longLengthID = 0;
  pZVar27 = (zc->blockState).prevCBlock;
  (zc->blockState).matchState.opt.symbolCosts = &pZVar27->entropy;
  uVar17 = (int)src - *(int *)&(zc->blockState).matchState.window.base;
  UVar4 = (zc->blockState).matchState.nextToUpdate;
  if (UVar4 + 0x180 < uVar17) {
    uVar23 = (uVar17 - UVar4) - 0x180;
    if (0xbf < uVar23) {
      uVar23 = 0xc0;
    }
    (zc->blockState).matchState.nextToUpdate = uVar17 - uVar23;
  }
  ms = &(zc->blockState).matchState;
  local_168 = &zc->seqStore;
  uVar17 = (zc->blockState).matchState.window.dictLimit;
  uVar23 = (zc->blockState).matchState.window.lowLimit;
  pZVar8 = (zc->blockState).nextCBlock;
  lVar24 = 0;
  do {
    pZVar8->rep[lVar24] = pZVar27->rep[lVar24];
    lVar24 = lVar24 + 1;
  } while (lVar24 != 3);
  local_188 = (uint *)dst;
  local_140 = srcSize;
  if ((zc->externSeqStore).pos < (zc->externSeqStore).size) {
    sVar14 = ZSTD_ldm_blockCompress
                       (&zc->externSeqStore,ms,local_168,((zc->blockState).nextCBlock)->rep,
                        &(zc->appliedParams).cParams,src,srcSize,(uint)(uVar23 < uVar17));
LAB_00188f01:
    memcpy((zc->seqStore).lit,(void *)((long)src + (srcSize - sVar14)),sVar14);
    ppBVar1 = &(zc->seqStore).lit;
    *ppBVar1 = *ppBVar1 + sVar14;
    bVar13 = true;
  }
  else {
    if ((zc->appliedParams).ldmParams.enableLdm == 0) {
      sVar14 = (*ZSTD_selectBlockCompressor::blockCompressor[uVar23 < uVar17]
                 [(zc->appliedParams).cParams.strategy])
                         (ms,local_168,((zc->blockState).nextCBlock)->rep,
                          &(zc->appliedParams).cParams,src,srcSize);
      goto LAB_00188f01;
    }
    ldmSeqStore.pos = 0;
    ldmSeqStore.seq = zc->ldmSequences;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = zc->maxNbLdmSequences;
    ldmSeqStore._16_16_ = auVar10 << 0x40;
    unaff_RBP = ZSTD_ldm_generateSequences
                          (&zc->ldmState,&ldmSeqStore,&(zc->appliedParams).ldmParams,src,srcSize);
    if (unaff_RBP < 0xffffffffffffff89) {
      sVar14 = ZSTD_ldm_blockCompress
                         (&ldmSeqStore,ms,local_168,((zc->blockState).nextCBlock)->rep,
                          &(zc->appliedParams).cParams,src,local_140,(uint)(uVar23 < uVar17));
      srcSize = local_140;
      goto LAB_00188f01;
    }
    bVar13 = false;
  }
  if (!bVar13) {
    return unaff_RBP;
  }
  pZVar27 = (zc->blockState).prevCBlock;
  pZVar8 = (zc->blockState).nextCBlock;
  local_180 = zc->entropyWorkspace;
  local_150 = (ulong)(uint)zc->bmi2;
  uVar17 = (zc->appliedParams).cParams.windowLog;
  local_120 = (zc->seqStore).sequencesStart;
  local_158 = (zc->seqStore).ofCode;
  local_148 = (zc->seqStore).llCode;
  local_160 = (zc->seqStore).mlCode;
  local_178 = (zc->seqStore).sequences;
  src_00 = (zc->seqStore).litStart;
  pBVar9 = (zc->seqStore).lit;
  ZVar5 = (zc->appliedParams).cParams.strategy;
  iVar19 = (zc->appliedParams).disableLiteralCompression;
  (pZVar8->entropy).hufCTable_repeatMode = (pZVar27->entropy).hufCTable_repeatMode;
  srcSize_00 = (long)pBVar9 - (long)src_00;
  uVar21 = ((ulong)(0x3ff < srcSize_00) + 1) - (ulong)(srcSize_00 < 0x4000);
  memcpy(pZVar8,pZVar27,0x400);
  local_190 = pZVar27;
  if (iVar19 == 0) {
    uVar25 = 0x3f;
    if ((pZVar27->entropy).hufCTable_repeatMode == HUF_repeat_valid) {
      uVar25 = 6;
    }
    local_170 = uVar21;
    if (uVar25 < srcSize_00) {
      uVar21 = uVar21 + 3;
      pbVar15 = (byte *)0xffffffffffffffba;
      sVar14 = dstCapacity - uVar21;
      puVar26 = local_188;
      if (uVar21 <= dstCapacity && sVar14 != 0) {
        local_170 = srcSize_00 >> 6;
        HVar6 = (pZVar27->entropy).hufCTable_repeatMode;
        ldmSeqStore.seq._0_4_ = HVar6;
        bVar13 = srcSize_00 < 0x401 && ZVar5 < ZSTD_lazy;
        if (uVar21 == 3 && HVar6 == HUF_repeat_valid || srcSize_00 < 0x100) {
          uVar25 = HUF_compress1X_repeat
                             ((void *)((long)local_188 + uVar21),sVar14,src_00,srcSize_00,0xff,0xb,
                              local_180,0x1800,(HUF_CElt *)pZVar8,(HUF_repeat *)&ldmSeqStore,
                              (uint)bVar13,(int)local_150);
        }
        else {
          uVar25 = HUF_compress4X_repeat
                             ((void *)((long)local_188 + uVar21),sVar14,src_00,srcSize_00,0xff,0xb,
                              local_180,0x1800,(HUF_CElt *)pZVar8,(HUF_repeat *)&ldmSeqStore,
                              (uint)bVar13,(int)local_150);
        }
        uVar23 = 3 - ((HUF_repeat)ldmSeqStore.seq == 0);
        if ((srcSize_00 - local_170) - 2 <= uVar25 || 0xffffffffffffff87 < uVar25 - 1) {
          memcpy(pZVar8,local_190,0x400);
          goto LAB_0018900f;
        }
        iVar19 = (int)srcSize_00;
        if (uVar25 == 1) {
          memcpy(pZVar8,local_190,0x400);
          lVar24 = ((ulong)(0x1f < srcSize_00) + 1) - (ulong)(srcSize_00 < 0x1000);
          lVar16 = lVar24 + 1;
          if (lVar16 == 3) {
            *local_188 = iVar19 << 4 | 0xd;
          }
          else if ((int)lVar16 == 2) {
            *(ushort *)local_188 = (ushort)(iVar19 << 4) | 5;
          }
          else {
            *(char *)local_188 = (char)srcSize_00 * '\b' + '\x01';
          }
          *(BYTE *)((long)local_188 + lVar16) = *src_00;
          pbVar15 = (byte *)(ulong)((int)lVar24 + 2);
          puVar26 = local_188;
        }
        else {
          if ((HUF_repeat)ldmSeqStore.seq == 0) {
            (pZVar8->entropy).hufCTable_repeatMode = HUF_repeat_check;
          }
          iVar18 = (int)uVar25;
          if (uVar21 == 5) {
            *local_188 = iVar18 * 0x400000 + iVar19 * 0x10 | uVar23 | 0xc;
            *(char *)(local_188 + 1) = (char)(uVar25 >> 10);
          }
          else if (uVar21 == 4) {
            *local_188 = iVar18 * 0x40000 + iVar19 * 0x10 | uVar23 | 8;
          }
          else {
            iVar19 = iVar18 * 0x4000 +
                     ((uVar23 | iVar19 * 0x10 +
                                (uint)(uVar21 == 3 && HVar6 == HUF_repeat_valid ||
                                      srcSize_00 < 0x100) * 4) ^ 4);
            *(short *)local_188 = (short)iVar19;
            *(char *)((long)local_188 + 2) = (char)((uint)iVar19 >> 0x10);
          }
          pbVar15 = (byte *)(uVar25 + uVar21);
          puVar26 = local_188;
        }
      }
    }
    else {
      pbVar15 = (byte *)ZSTD_noCompressLiterals(local_188,dstCapacity,src_00,srcSize_00);
      puVar26 = local_188;
    }
  }
  else {
LAB_0018900f:
    puVar26 = local_188;
    pbVar15 = (byte *)ZSTD_noCompressLiterals(local_188,dstCapacity,src_00,srcSize_00);
  }
  uVar23 = ZSTD_isError((size_t)pbVar15);
  pZVar27 = local_190;
  code = pbVar15;
  if ((uVar23 == 0) && (code = (byte *)0xffffffffffffffba, 3 < (long)(dstCapacity - (long)pbVar15)))
  {
    local_170 = (long)local_178 - (long)local_120 >> 3;
    pbVar15 = pbVar15 + (long)puVar26;
    if (local_170 < 0x7f) {
      *pbVar15 = (byte)local_170;
      pbVar15 = pbVar15 + 1;
    }
    else if (local_170 < 0x7f00) {
      *pbVar15 = (byte)(local_170 >> 8) | 0x80;
      pbVar15[1] = (byte)local_170;
      pbVar15 = pbVar15 + 2;
    }
    else {
      *pbVar15 = 0xff;
      *(short *)(pbVar15 + 1) = (short)local_170 + -0x7f00;
      pbVar15 = pbVar15 + 3;
    }
    __dest = (pZVar8->entropy).litlengthCTable;
    __dest_01 = (pZVar8->entropy).offcodeCTable;
    __dest_00 = (pZVar8->entropy).matchlengthCTable;
    if (local_178 == local_120) {
      memcpy(__dest,(local_190->entropy).litlengthCTable,0x524);
      (pZVar8->entropy).litlength_repeatMode = (pZVar27->entropy).litlength_repeatMode;
      memcpy(__dest_01,(pZVar27->entropy).offcodeCTable,0x304);
      (pZVar8->entropy).offcode_repeatMode = (pZVar27->entropy).offcode_repeatMode;
      memcpy(__dest_00,(pZVar27->entropy).matchlengthCTable,0x5ac);
      (pZVar8->entropy).matchlength_repeatMode = (pZVar27->entropy).matchlength_repeatMode;
      code = pbVar15 + -(long)local_188;
    }
    else {
      local_178 = (seqDef *)((long)puVar26 + dstCapacity);
      pbVar22 = pbVar15 + 1;
      local_138 = __dest_00;
      local_130 = __dest_01;
      local_128 = __dest;
      ZSTD_seqToCodes(local_168);
      uVar21 = local_170;
      workspace = local_180;
      max = 0x23;
      sVar30 = 0x1893d8;
      sVar14 = FSE_countFast_wksp((uint *)&ldmSeqStore,&max,local_148,local_170,local_180);
      FVar7 = (local_190->entropy).litlength_repeatMode;
      (pZVar8->entropy).litlength_repeatMode = FVar7;
      FVar20 = FSE_repeat_check;
      type = set_rle;
      if (uVar21 < 3 || sVar14 != uVar21) {
        type = set_repeat;
        if (999 < uVar21 || FVar7 != FSE_repeat_valid) {
          bVar13 = uVar21 >> 5 <= sVar14 && 0x3f < uVar21;
          FVar20 = (FSE_repeat)bVar13;
          type = (uint)bVar13 + (uint)bVar13;
          goto LAB_00189442;
        }
      }
      else {
LAB_00189442:
        (pZVar8->entropy).litlength_repeatMode = FVar20;
      }
      code = (byte *)ZSTD_buildCTable(pbVar22,(long)local_178 - (long)pbVar22,local_128,9,type,
                                      (U32 *)&ldmSeqStore,max,local_148,uVar21,LL_defaultNorm,6,0x23
                                      ,(local_190->entropy).litlengthCTable,0x524,workspace,sVar30);
      uVar23 = ZSTD_isError((size_t)code);
      if (uVar23 == 0) {
        local_168 = (seqStore_t *)CONCAT44(local_168._4_4_,type);
        pbVar22 = pbVar22 + (long)code;
        max = 0x1f;
        sVar30 = 0x189503;
        sVar14 = FSE_countFast_wksp((uint *)&ldmSeqStore,&max,local_158,uVar21,local_180);
        FVar7 = (local_190->entropy).offcode_repeatMode;
        (pZVar8->entropy).offcode_repeatMode = FVar7;
        FVar20 = FSE_repeat_check;
        if ((sVar14 == uVar21) && (2 < uVar21 || 0x1c < max)) {
          uVar28 = 1;
LAB_001896ad:
          (pZVar8->entropy).offcode_repeatMode = FVar20;
        }
        else {
          if (0x1c < max) {
LAB_001896a2:
            uVar28 = 2;
            FVar20 = FSE_repeat_check;
            goto LAB_001896ad;
          }
          uVar28 = 3;
          if (999 < uVar21 || FVar7 != FSE_repeat_valid) {
            FVar20 = FSE_repeat_none;
            uVar28 = 0;
            if (sVar14 < uVar21 >> 4 || uVar21 < 0x40) goto LAB_001896ad;
            goto LAB_001896a2;
          }
        }
        code = (byte *)ZSTD_buildCTable(pbVar22,(long)local_178 - (long)pbVar22,local_130,8,
                                        (symbolEncodingType_e)uVar28,(U32 *)&ldmSeqStore,max,
                                        local_158,uVar21,OF_defaultNorm,5,0x1c,
                                        (local_190->entropy).offcodeCTable,0x304,local_180,sVar30);
        uVar23 = ZSTD_isError((size_t)code);
        if (uVar23 == 0) {
          pZVar27 = (ZSTD_compressedBlockState_t *)(pbVar22 + (long)code);
          max = 0x34;
          sVar30 = 0x189771;
          local_110 = uVar28;
          sVar14 = FSE_countFast_wksp((uint *)&ldmSeqStore,&max,local_160,uVar21,local_180);
          psVar12 = local_178;
          FVar7 = (local_190->entropy).matchlength_repeatMode;
          (pZVar8->entropy).matchlength_repeatMode = FVar7;
          FVar20 = FSE_repeat_check;
          local_118 = 1;
          if (uVar21 < 3 || sVar14 != uVar21) {
            local_118 = 3;
            if (999 < uVar21 || FVar7 != FSE_repeat_valid) {
              bVar13 = uVar21 >> 5 <= sVar14 && 0x3f < uVar21;
              FVar20 = (FSE_repeat)bVar13;
              local_118 = (ulong)((uint)bVar13 + (uint)bVar13);
              goto LAB_001897e8;
            }
          }
          else {
LAB_001897e8:
            (pZVar8->entropy).matchlength_repeatMode = FVar20;
          }
          pZVar11 = &local_190->entropy;
          local_190 = pZVar27;
          code = (byte *)ZSTD_buildCTable(pZVar27,(long)local_178 - (long)pZVar27,local_138,9,
                                          (symbolEncodingType_e)local_118,(U32 *)&ldmSeqStore,max,
                                          local_160,uVar21,ML_defaultNorm,6,0x34,
                                          pZVar11->matchlengthCTable,0x5ac,local_180,sVar30);
          uVar23 = ZSTD_isError((size_t)code);
          if (uVar23 == 0) {
            pbVar22 = code + (long)&local_190->entropy;
            *pbVar15 = ((byte)((int)local_110 << 4) | (byte)((int)local_168 << 6)) +
                       (char)local_118 * '\x04';
            code = (byte *)ZSTD_encodeSequences
                                     (pbVar22,(long)psVar12 - (long)pbVar22,local_138,local_160,
                                      local_130,local_158,local_128,local_148,local_120,uVar21,
                                      (uint)(0x39 < uVar17),(int)local_150);
            uVar17 = ZSTD_isError((size_t)code);
            if (uVar17 == 0) {
              code = pbVar22 + ((long)code - (long)local_188);
            }
          }
        }
      }
    }
  }
  sVar14 = local_140;
  if ((dstCapacity < local_140) || (code != (byte *)0xffffffffffffffba)) {
    uVar17 = ZSTD_isError((size_t)code);
    if (uVar17 != 0) goto LAB_001895f2;
    if (code < (byte *)((sVar14 - (sVar14 >> 6)) + -2)) {
      if ((pZVar8->entropy).offcode_repeatMode == FSE_repeat_valid) {
        (pZVar8->entropy).offcode_repeatMode = FSE_repeat_check;
      }
      goto LAB_001895f2;
    }
  }
  code = (byte *)0x0;
LAB_001895f2:
  uVar17 = ZSTD_isError((size_t)code);
  if ((code != (byte *)0x0) && (uVar17 == 0)) {
    uVar2 = (zc->blockState).prevCBlock;
    uVar3 = (zc->blockState).nextCBlock;
    auVar29._8_4_ = (int)uVar2;
    auVar29._0_8_ = uVar3;
    auVar29._12_4_ = (int)((ulong)uVar2 >> 0x20);
    (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar3;
    (zc->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar29._8_8_;
  }
  return (size_t)code;
}

Assistant:

static size_t ZSTD_compressBlock_internal(ZSTD_CCtx* zc,
                                        void* dst, size_t dstCapacity,
                                        const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    DEBUGLOG(5, "ZSTD_compressBlock_internal (dstCapacity=%zu, dictLimit=%u, nextToUpdate=%u)",
                dstCapacity, ms->window.dictLimit, ms->nextToUpdate);

    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1) {
        ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.searchLength);
        return 0;   /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;   /* required for optimal parser to read stats from dictionary */

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 current = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (current > ms->nextToUpdate + 384)
            ms->nextToUpdate = current - MIN(192, (U32)(current - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   U32 const extDict = ZSTD_window_hasExtDict(ms->window);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(!zc->appliedParams.ldmParams.enableLdm);
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       &zc->appliedParams.cParams,
                                       src, srcSize, extDict);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm) {
            rawSeqStore_t ldmSeqStore = {NULL, 0, 0, 0};

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            CHECK_F(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize));
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       &zc->appliedParams.cParams,
                                       src, srcSize, extDict);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else {   /* not long range mode */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy, extDict);
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, &zc->appliedParams.cParams, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }

    /* encode sequences and literals */
    {   size_t const cSize = ZSTD_compressSequences(&zc->seqStore,
                                &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
                                &zc->appliedParams,
                                dst, dstCapacity,
                                srcSize, zc->entropyWorkspace, zc->bmi2);
        if (ZSTD_isError(cSize) || cSize == 0) return cSize;
        /* confirm repcodes and entropy tables */
        {   ZSTD_compressedBlockState_t* const tmp = zc->blockState.prevCBlock;
            zc->blockState.prevCBlock = zc->blockState.nextCBlock;
            zc->blockState.nextCBlock = tmp;
        }
        return cSize;
    }
}